

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::ternary_each<int>(Omega_h *this,Bytes *cond,Read<int> *a,Read<int> *b)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_188;
  undefined1 local_178 [8];
  type f;
  allocator local_119;
  string local_118 [32];
  undefined1 local_f8 [8];
  Write<int> c;
  int width;
  Read<int> *b_local;
  Read<int> *a_local;
  Bytes *cond_local;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  int local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_20 >> 2) == (int)(local_30 >> 2)) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_40 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_40 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    if (((ulong)(cond->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = (int)((cond->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (int)((ulong)(cond->write_).shared_alloc_.alloc >> 3);
    }
    c.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_40 >> 2),local_10);
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_50 = ((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_50 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"",&local_119);
    Write<int>::Write((Write<int> *)local_f8,(LO)(local_50 >> 2),(string *)local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    Write<int>::Write((Write<int> *)local_178,(Write<int> *)local_f8);
    Read<signed_char>::Read((Read<signed_char> *)&f.c.shared_alloc_.direct_ptr,cond);
    f.cond.write_.shared_alloc_.direct_ptr._0_4_ = c.shared_alloc_.direct_ptr._4_4_;
    Read<int>::Read((Read<int> *)&f.width,a);
    Read<int>::Read((Read<int> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)local_f8 & 1) == 0) {
      local_60 = *(size_t *)local_f8;
    }
    else {
      local_60 = (ulong)local_f8 >> 3;
    }
    parallel_for<Omega_h::ternary_each<int>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Read<int>)::_lambda(int)_1_>
              ((LO)(local_60 >> 2),(type *)local_178,"ternary_each");
    Write<int>::Write(&local_188,(Write<int> *)local_f8);
    Read<int>::Read((Read<int> *)this,&local_188);
    Write<int>::~Write(&local_188);
    ternary_each<int>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Read<int>)::
    {lambda(int)#1}::~Read((_lambda_int__1_ *)local_178);
    Write<int>::~Write((Write<int> *)local_f8);
    RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x137);
}

Assistant:

Read<T> ternary_each(Bytes cond, Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto width = divide_no_remainder(a.size(), cond.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = cond[i / width] ? a[i] : b[i]; };
  parallel_for(c.size(), f, "ternary_each");
  return c;
}